

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

RuntimeFunction * __thiscall
Js::JavascriptLibrary::CreateGetterFunction
          (JavascriptLibrary *this,PropertyId nameId,FunctionInfo *functionInfo)

{
  JavascriptString *pJVar1;
  PropertyString *pstRight;
  RuntimeFunction *pRVar2;
  
  pJVar1 = StringCache::GetGetterFunctionPrefix(&this->stringCache);
  pstRight = ScriptContext::GetPropertyString
                       ((this->super_JavascriptLibraryBase).scriptContext.ptr,nameId);
  pJVar1 = JavascriptString::Concat(pJVar1,&pstRight->super_JavascriptString);
  pRVar2 = DefaultCreateFunction(this,functionInfo,0,(DynamicObject *)0x0,(DynamicType *)0x0,pJVar1)
  ;
  (*(pRVar2->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pRVar2,0xd1,0x1000000000000,2,0,0,0xf);
  return pRVar2;
}

Assistant:

RuntimeFunction* JavascriptLibrary::CreateGetterFunction(PropertyId nameId, FunctionInfo* functionInfo)
    {
        Var name_withGetPrefix = JavascriptString::Concat(GetGetterFunctionPrefixString(), scriptContext->GetPropertyString(nameId));
        RuntimeFunction* getterFunction = DefaultCreateFunction(functionInfo, 0, nullptr, nullptr, name_withGetPrefix);
        getterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable, nullptr);
        return getterFunction;
    }